

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Mask.cpp
# Opt level: O0

void __thiscall amrex::Mask::readFrom(Mask *this,istream *is)

{
  istream *this_00;
  int *piVar1;
  BaseFab<int> *in_RSI;
  Box *in_RDI;
  istream *unaff_retaddr;
  int len;
  int *ptr;
  int ncomp;
  Box b;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  BaseFab<int> *in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffe4;
  Box *in_stack_ffffffffffffffe8;
  
  std::istream::ignore((long)in_RSI,100000);
  Box::Box((Box *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  this_00 = amrex::operator>>(unaff_retaddr,in_RDI);
  std::istream::operator>>(this_00,(int *)&stack0xffffffffffffffd0);
  std::istream::ignore((long)in_RSI,100000);
  BaseFab<int>::resize
            (in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4,
             (Arena *)in_stack_ffffffffffffffd8);
  piVar1 = BaseFab<int>::dataPtr(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
  Box::numPts((Box *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  std::istream::read((char *)in_RSI,(long)piVar1);
  std::istream::ignore((long)in_RSI,100000);
  return;
}

Assistant:

void
Mask::readFrom (std::istream& is)
{
    is.ignore(BL_IGNORE_MAX,':');
    Box b;
    int ncomp;
    is >> b >> ncomp;
    is.ignore(BL_IGNORE_MAX, '\n');
    resize(b,ncomp);
    int *ptr = dataPtr();
    int len = domain.numPts();
    is.read( (char*) ptr, len*sizeof(int) );
    is.ignore(BL_IGNORE_MAX, '\n');
}